

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O2

int isCarbonylAtom(atom *a)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  char *__needle;
  
  __needle = a->r->resname;
  pcVar2 = strstr(":GLY:ALA:VAL:PHE:PRO:MET:ILE:LEU:ASP:GLU:LYS:ARG:SER:THR:TYR:HIS:CYS:ASN:GLN:TRP:ASX:GLX:ACE:FOR:NH2:NME:MSE:AIB:ABU:PCA:"
                  ,__needle);
  if ((pcVar2 != (char *)0x0) && (iVar1 = strcmp(a->atomname," C  "), iVar1 == 0)) {
    return 1;
  }
  pcVar2 = strstr(":ASP:ASN:ASX:",__needle);
  if ((pcVar2 != (char *)0x0) && (pcVar2 = strstr(": CG :",a->atomname), pcVar2 != (char *)0x0)) {
    return 1;
  }
  pcVar2 = strstr(":GLU:GLN:GLX:",__needle);
  if (pcVar2 == (char *)0x0) {
    uVar3 = 0;
  }
  else {
    pcVar2 = strstr(": CD :",a->atomname);
    uVar3 = (uint)(pcVar2 != (char *)0x0);
  }
  return uVar3;
}

Assistant:

int isCarbonylAtom(atom *a) { /* limitation: this will not handle het groups properly */
   return (strstr(AAList, a->r->resname) && (!strcmp(a->atomname,  " C  ")))
   ||((strstr(":ASP:ASN:ASX:",a->r->resname))&&(strstr(": CG :",a->atomname)))
   ||((strstr(":GLU:GLN:GLX:",a->r->resname))&&(strstr(": CD :",a->atomname)));
}